

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SpectrumMixTexture::Evaluate
          (SpectrumMixTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  TextureEvalContext TVar1;
  SampledWavelengths SVar2;
  Float a;
  undefined1 auVar7 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  ulong in_XMM1_Qa;
  undefined1 auVar12 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  SampledSpectrum SVar13;
  anon_class_16_2_278d1f37 func;
  anon_class_16_2_278d1f37 func_00;
  SampledSpectrum t1;
  SampledWavelengths local_a8;
  TextureEvalContext local_88;
  SampledSpectrum local_40;
  SampledSpectrum local_30;
  
  SVar2 = lambda;
  TVar1 = ctx;
  local_88.p.super_Tuple3<pbrt::Point3,_float>.x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_88.p.super_Tuple3<pbrt::Point3,_float>.y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_88.p.super_Tuple3<pbrt::Point3,_float>.z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_88.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_88.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_88.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_88.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_88.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_88.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_88.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  local_88.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  local_88.dudx = ctx.dudx;
  local_88.dudy = ctx.dudy;
  local_88.dvdx = ctx.dvdx;
  local_88.dvdy = ctx.dvdy;
  local_88.faceIndex = ctx.faceIndex;
  local_a8.lambda.values[0] = lambda.lambda.values[0];
  local_a8.lambda.values[1] = lambda.lambda.values[1];
  local_a8.lambda.values[2] = lambda.lambda.values[2];
  local_a8.lambda.values[3] = lambda.lambda.values[3];
  local_a8.pdf.values[0] = lambda.pdf.values[0];
  local_a8.pdf.values[1] = lambda.pdf.values[1];
  local_a8.pdf.values[2] = lambda.pdf.values[2];
  local_a8.pdf.values[3] = lambda.pdf.values[3];
  auVar7 = ZEXT856((ulong)lambda.lambda.values._8_8_);
  auVar12 = ZEXT856(in_XMM1_Qa);
  func.lambda = &local_a8;
  func.ctx = &local_88;
  SVar13 = TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
           ::
           Dispatch<pbrt::SpectrumTextureHandle::Evaluate(pbrt::TextureEvalContext,pbrt::SampledWavelengths)const::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
                       *)this,func);
  auVar8._0_8_ = SVar13.values.values._8_8_;
  auVar8._8_56_ = auVar12;
  auVar3._0_8_ = SVar13.values.values._0_8_;
  auVar3._8_56_ = auVar7;
  local_30.values.values = (array<float,_4>)vmovlhps_avx(auVar3._0_16_,auVar8._0_16_);
  local_88.p.super_Tuple3<pbrt::Point3,_float>.x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_88.p.super_Tuple3<pbrt::Point3,_float>.y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_88.p.super_Tuple3<pbrt::Point3,_float>.z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_88.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_88.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_88.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_88.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_88.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_88.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_88.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  local_88.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  local_88.dudx = ctx.dudx;
  local_88.dudy = ctx.dudy;
  local_88.dvdx = ctx.dvdx;
  local_88.dvdy = ctx.dvdy;
  local_88.faceIndex = ctx.faceIndex;
  local_a8.lambda = SVar2.lambda.values;
  local_a8.pdf.values[0] = lambda.pdf.values[0];
  local_a8.pdf.values[1] = lambda.pdf.values[1];
  local_a8.pdf.values[2] = lambda.pdf.values[2];
  local_a8.pdf.values[3] = lambda.pdf.values[3];
  auVar7 = ZEXT856((ulong)lambda.lambda.values._8_8_);
  auVar12 = ZEXT856(auVar12._0_8_);
  func_00.lambda = &local_a8;
  func_00.ctx = &local_88;
  SVar13 = TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
           ::
           Dispatch<pbrt::SpectrumTextureHandle::Evaluate(pbrt::TextureEvalContext,pbrt::SampledWavelengths)const::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::RGBConstantTexture,pbrt::RGBReflectanceConstantTexture,pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
                       *)&this->tex2,func_00);
  auVar9._0_8_ = SVar13.values.values._8_8_;
  auVar9._8_56_ = auVar12;
  auVar4._0_8_ = SVar13.values.values._0_8_;
  auVar4._8_56_ = auVar7;
  local_a8.lambda.values = (float  [4])vmovlhps_avx(auVar4._0_16_,auVar9._0_16_);
  local_88._0_16_ = TVar1._0_16_;
  local_88.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_88.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_88.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_88.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_88.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_88.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  local_88.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  local_88.dudx = ctx.dudx;
  local_88.dudy = ctx.dudy;
  local_88.dvdx = ctx.dvdx;
  local_88.dvdy = ctx.dvdy;
  local_88.faceIndex = ctx.faceIndex;
  a = TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
      ::
      Dispatch<pbrt::FloatTextureHandle::Evaluate(pbrt::TextureEvalContext)const::_lambda(auto:1)_1_>
                ((TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
                  *)&this->amount,&local_88);
  auVar12 = (undefined1  [56])0x0;
  auVar7 = (undefined1  [56])0x0;
  SVar13 = SampledSpectrum::operator*(&local_30,1.0 - a);
  auVar10._0_8_ = SVar13.values.values._8_8_;
  auVar10._8_56_ = auVar12;
  auVar5._0_8_ = SVar13.values.values._0_8_;
  auVar5._8_56_ = auVar7;
  local_88._0_16_ = vmovlhps_avx(auVar5._0_16_,auVar10._0_16_);
  auVar7 = (undefined1  [56])0x0;
  SVar13 = SampledSpectrum::operator*((SampledSpectrum *)&local_a8,a);
  auVar11._0_8_ = SVar13.values.values._8_8_;
  auVar11._8_56_ = auVar12;
  auVar6._0_8_ = SVar13.values.values._0_8_;
  auVar6._8_56_ = auVar7;
  local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar11._0_16_);
  SVar13 = SampledSpectrum::operator+((SampledSpectrum *)&local_88,&local_40);
  return (array<float,_4>)(array<float,_4>)SVar13;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        SampledSpectrum t1 = tex1.Evaluate(ctx, lambda);
        SampledSpectrum t2 = tex2.Evaluate(ctx, lambda);
        Float amt = amount.Evaluate(ctx);
        return (1 - amt) * t1 + amt * t2;
    }